

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
b_array::
Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
::Array(Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
        *this,size_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  size_t *psVar4;
  long lVar5;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  uVar2 = SUB168(auVar1 * ZEXT816(0x28),0);
  uVar3 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar2 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x28),8) == 0) {
    uVar2 = uVar3;
  }
  this->capacity = size;
  this->data = (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)0x0;
  psVar4 = (size_t *)operator_new__(uVar2);
  *psVar4 = size;
  if (size != 0) {
    lVar5 = 0;
    do {
      local_48 = 0;
      local_40[0] = 0;
      local_50 = local_40;
      std::__cxx11::string::string
                ((string *)
                 ((long)&(((Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                            *)(psVar4 + 1))->key)._M_dataplus._M_p + lVar5),(string *)&local_50);
      *(undefined8 *)((long)psVar4 + lVar5 + 0x28) = 0;
      std::__cxx11::string::~string((string *)&local_50);
      lVar5 = lVar5 + 0x28;
    } while (size * 0x28 - lVar5 != 0);
  }
  this->data = (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)(psVar4 + 1);
  return;
}

Assistant:

Array<T>::Array(size_t size) {
    capacity = size;
    data = new T[capacity]();
}